

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

void HUF_fillDTableX2ForWeight
               (HUF_DEltX2 *DTableRank,sortedSymbol_t *begin,sortedSymbol_t *end,U32 nbBits,
               U32 tableLog,U16 baseSeq,int level)

{
  uint uVar1;
  HUF_DEltX2 HVar2;
  U64 UVar3;
  sortedSymbol_t *psVar4;
  HUF_DEltX2 *DTableRankEnd;
  U64 DEltX2_2;
  U64 DEltX2_1;
  U64 DEltX2;
  HUF_DEltX2 DElt_1;
  HUF_DEltX2 DElt;
  sortedSymbol_t *ptr;
  U32 length;
  U16 baseSeq_local;
  U32 tableLog_local;
  U32 nbBits_local;
  sortedSymbol_t *end_local;
  sortedSymbol_t *begin_local;
  HUF_DEltX2 *DTableRank_local;
  
  uVar1 = 1 << ((char)tableLog - (char)nbBits & 0x1fU);
  if ((0 < level) && (level < 3)) {
    _DElt_1 = begin;
    begin_local = (sortedSymbol_t *)DTableRank;
    switch(uVar1) {
    case 1:
      begin_local = (sortedSymbol_t *)DTableRank;
      for (; _DElt_1 != end; _DElt_1 = _DElt_1 + 1) {
        HVar2 = HUF_buildDEltX2((uint)_DElt_1->symbol,nbBits,(uint)baseSeq,level);
        *(HUF_DEltX2 *)begin_local = HVar2;
        begin_local = begin_local + 4;
      }
      break;
    case 2:
      for (; _DElt_1 != end; _DElt_1 = _DElt_1 + 1) {
        HVar2 = HUF_buildDEltX2((uint)_DElt_1->symbol,nbBits,(uint)baseSeq,level);
        *(HUF_DEltX2 *)begin_local = HVar2;
        *(HUF_DEltX2 *)(begin_local + 4) = HVar2;
        begin_local = begin_local + 8;
      }
      break;
    default:
      for (; _DElt_1 != end; _DElt_1 = _DElt_1 + 1) {
        UVar3 = HUF_buildDEltX2U64((uint)_DElt_1->symbol,nbBits,baseSeq,level);
        psVar4 = begin_local + (ulong)uVar1 * 4;
        for (; begin_local != psVar4; begin_local = begin_local + 0x20) {
          *(U64 *)begin_local = UVar3;
          *(U64 *)(begin_local + 8) = UVar3;
          *(U64 *)(begin_local + 0x10) = UVar3;
          *(U64 *)(begin_local + 0x18) = UVar3;
        }
      }
      break;
    case 4:
      for (; _DElt_1 != end; _DElt_1 = _DElt_1 + 1) {
        UVar3 = HUF_buildDEltX2U64((uint)_DElt_1->symbol,nbBits,baseSeq,level);
        *(U64 *)begin_local = UVar3;
        *(U64 *)(begin_local + 8) = UVar3;
        begin_local = begin_local + 0x10;
      }
      break;
    case 8:
      for (; _DElt_1 != end; _DElt_1 = _DElt_1 + 1) {
        UVar3 = HUF_buildDEltX2U64((uint)_DElt_1->symbol,nbBits,baseSeq,level);
        *(U64 *)begin_local = UVar3;
        *(U64 *)(begin_local + 8) = UVar3;
        *(U64 *)(begin_local + 0x10) = UVar3;
        *(U64 *)(begin_local + 0x18) = UVar3;
        begin_local = begin_local + 0x20;
      }
    }
    return;
  }
  __assert_fail("level >= 1 && level <= 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                ,0x3c7,
                "void HUF_fillDTableX2ForWeight(HUF_DEltX2 *, const sortedSymbol_t *, const sortedSymbol_t *, U32, U32, U16, const int)"
               );
}

Assistant:

static void HUF_fillDTableX2ForWeight(
    HUF_DEltX2* DTableRank,
    sortedSymbol_t const* begin, sortedSymbol_t const* end,
    U32 nbBits, U32 tableLog,
    U16 baseSeq, int const level)
{
    U32 const length = 1U << ((tableLog - nbBits) & 0x1F /* quiet static-analyzer */);
    const sortedSymbol_t* ptr;
    assert(level >= 1 && level <= 2);
    switch (length) {
    case 1:
        for (ptr = begin; ptr != end; ++ptr) {
            HUF_DEltX2 const DElt = HUF_buildDEltX2(ptr->symbol, nbBits, baseSeq, level);
            *DTableRank++ = DElt;
        }
        break;
    case 2:
        for (ptr = begin; ptr != end; ++ptr) {
            HUF_DEltX2 const DElt = HUF_buildDEltX2(ptr->symbol, nbBits, baseSeq, level);
            DTableRank[0] = DElt;
            DTableRank[1] = DElt;
            DTableRank += 2;
        }
        break;
    case 4:
        for (ptr = begin; ptr != end; ++ptr) {
            U64 const DEltX2 = HUF_buildDEltX2U64(ptr->symbol, nbBits, baseSeq, level);
            ZSTD_memcpy(DTableRank + 0, &DEltX2, sizeof(DEltX2));
            ZSTD_memcpy(DTableRank + 2, &DEltX2, sizeof(DEltX2));
            DTableRank += 4;
        }
        break;
    case 8:
        for (ptr = begin; ptr != end; ++ptr) {
            U64 const DEltX2 = HUF_buildDEltX2U64(ptr->symbol, nbBits, baseSeq, level);
            ZSTD_memcpy(DTableRank + 0, &DEltX2, sizeof(DEltX2));
            ZSTD_memcpy(DTableRank + 2, &DEltX2, sizeof(DEltX2));
            ZSTD_memcpy(DTableRank + 4, &DEltX2, sizeof(DEltX2));
            ZSTD_memcpy(DTableRank + 6, &DEltX2, sizeof(DEltX2));
            DTableRank += 8;
        }
        break;
    default:
        for (ptr = begin; ptr != end; ++ptr) {
            U64 const DEltX2 = HUF_buildDEltX2U64(ptr->symbol, nbBits, baseSeq, level);
            HUF_DEltX2* const DTableRankEnd = DTableRank + length;
            for (; DTableRank != DTableRankEnd; DTableRank += 8) {
                ZSTD_memcpy(DTableRank + 0, &DEltX2, sizeof(DEltX2));
                ZSTD_memcpy(DTableRank + 2, &DEltX2, sizeof(DEltX2));
                ZSTD_memcpy(DTableRank + 4, &DEltX2, sizeof(DEltX2));
                ZSTD_memcpy(DTableRank + 6, &DEltX2, sizeof(DEltX2));
            }
        }
        break;
    }
}